

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O3

void __thiscall
PatternAddressMapper::PatternAddressMapper(PatternAddressMapper *this,PatternAddressMapper *other)

{
  pointer pcVar1;
  CodeJitter *pCVar2;
  size_t sVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  CodeJitter *pCVar7;
  size_t __i;
  ulong uVar8;
  pointer __p;
  ulong local_2770 [624];
  undefined8 local_13f0;
  undefined1 local_13e8 [8];
  __alloc_node_gen_t __alloc_node_gen;
  
  (this->victim_rows)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->victim_rows)._M_h._M_bucket_count = (other->victim_rows)._M_h._M_bucket_count;
  (this->victim_rows)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->victim_rows)._M_h._M_element_count = (other->victim_rows)._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(other->victim_rows)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (other->victim_rows)._M_h._M_rehash_policy._M_next_resize;
  (this->victim_rows)._M_h._M_rehash_policy._M_max_load_factor =
       (other->victim_rows)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->victim_rows)._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->victim_rows)._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->victim_rows)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_13e8 = (undefined1  [8])this;
  std::
  _Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<char_volatile*,false>>>>
            ((_Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)this,(_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)other,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<volatile_char_*,_false>_>_> *)
             local_13e8);
  (this->instance_id)._M_dataplus._M_p = (pointer)&(this->instance_id).field_2;
  pcVar1 = (other->instance_id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->instance_id,pcVar1,pcVar1 + (other->instance_id)._M_string_length);
  (this->gen)._M_x[0] = 0x1571;
  uVar8 = 0x1571;
  lVar6 = 0xc;
  do {
    uVar8 = (ulong)((((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar6) - 0xb);
    (this->gen)._M_x[lVar6 + -0xb] = uVar8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x27b);
  (this->gen)._M_p = 0x270;
  (this->code_jitter)._M_t.super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
  super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
  super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl = (CodeJitter *)0x0;
  this->min_row = other->min_row;
  this->max_row = other->max_row;
  this->bank_no = other->bank_no;
  local_13e8 = (undefined1  [8])&this->aggressor_to_addr;
  (this->aggressor_to_addr)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->aggressor_to_addr)._M_h._M_bucket_count = (other->aggressor_to_addr)._M_h._M_bucket_count;
  (this->aggressor_to_addr)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->aggressor_to_addr)._M_h._M_element_count = (other->aggressor_to_addr)._M_h._M_element_count
  ;
  uVar4 = *(undefined4 *)&(other->aggressor_to_addr)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (other->aggressor_to_addr)._M_h._M_rehash_policy._M_next_resize;
  (this->aggressor_to_addr)._M_h._M_rehash_policy._M_max_load_factor =
       (other->aggressor_to_addr)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->aggressor_to_addr)._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->aggressor_to_addr)._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->aggressor_to_addr)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,DRAMAddr>,false>>>>
            ((_Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_13e8,&(other->aggressor_to_addr)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_DRAMAddr>,_false>_>_>
              *)local_13e8);
  std::
  vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
  ::vector(&this->bit_flips,&other->bit_flips);
  this->reproducibility_score = other->reproducibility_score;
  pCVar7 = (CodeJitter *)operator_new(0x40);
  CodeJitter::CodeJitter(pCVar7);
  local_13e8 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>::reset
            ((__uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_> *)&this->code_jitter,
             pCVar7);
  std::unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_>::~unique_ptr
            ((unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_> *)local_13e8);
  pCVar7 = (other->code_jitter)._M_t.
           super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
           super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
           super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl;
  pCVar2 = (this->code_jitter)._M_t.
           super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
           super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
           super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl;
  pCVar2->num_aggs_for_sync = pCVar7->num_aggs_for_sync;
  pCVar2->total_activations = pCVar7->total_activations;
  pCVar2->fencing_strategy = pCVar7->fencing_strategy;
  pCVar2->flushing_strategy = pCVar7->flushing_strategy;
  pCVar2->pattern_sync_each_ref = pCVar7->pattern_sync_each_ref;
  std::random_device::random_device((random_device *)local_13e8);
  uVar5 = std::random_device::_M_getval();
  local_2770[0] = (ulong)uVar5;
  lVar6 = 1;
  uVar8 = local_2770[0];
  do {
    uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar6);
    local_2770[lVar6] = uVar8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_13f0 = 0x270;
  memcpy(&this->gen,local_2770,5000);
  std::random_device::_M_fini();
  return;
}

Assistant:

PatternAddressMapper::PatternAddressMapper(const PatternAddressMapper &other)
    : victim_rows(other.victim_rows),
      instance_id(other.instance_id),
      min_row(other.min_row),
      max_row(other.max_row),
      bank_no(other.bank_no),
      aggressor_to_addr(other.aggressor_to_addr),
      bit_flips(other.bit_flips),
      reproducibility_score(other.reproducibility_score) {
  code_jitter = std::make_unique<CodeJitter>();
  code_jitter->num_aggs_for_sync = other.get_code_jitter().num_aggs_for_sync;
  code_jitter->total_activations = other.get_code_jitter().total_activations;
  code_jitter->fencing_strategy = other.get_code_jitter().fencing_strategy;
  code_jitter->flushing_strategy = other.get_code_jitter().flushing_strategy;
  code_jitter->pattern_sync_each_ref = other.get_code_jitter().pattern_sync_each_ref;
  std::random_device rd;
  gen = std::mt19937(rd());
}